

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_context.cpp
# Opt level: O1

void __thiscall duckdb::TransactionContext::ClearTransaction(TransactionContext *this)

{
  _Head_base<0UL,_duckdb::MetaTransaction_*,_false> __ptr_00;
  pointer *__ptr;
  pointer __old_p;
  pointer local_8;
  
  __ptr = &local_8;
  this->auto_commit = true;
  __ptr_00._M_head_impl =
       (this->current_transaction).
       super_unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::MetaTransaction_*,_std::default_delete<duckdb::MetaTransaction>_>
       .super__Head_base<0UL,_duckdb::MetaTransaction_*,_false>._M_head_impl;
  local_8 = (MetaTransaction *)0x0;
  (this->current_transaction).
  super_unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>._M_t.
  super___uniq_ptr_impl<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::MetaTransaction_*,_std::default_delete<duckdb::MetaTransaction>_>.
  super__Head_base<0UL,_duckdb::MetaTransaction_*,_false>._M_head_impl = (MetaTransaction *)0x0;
  if (__ptr_00._M_head_impl != (MetaTransaction *)0x0) {
    ::std::default_delete<duckdb::MetaTransaction>::operator()
              ((default_delete<duckdb::MetaTransaction> *)&this->current_transaction,
               __ptr_00._M_head_impl);
  }
  if (local_8 != (MetaTransaction *)0x0) {
    ::std::default_delete<duckdb::MetaTransaction>::operator()
              ((default_delete<duckdb::MetaTransaction> *)__ptr,local_8);
  }
  return;
}

Assistant:

void TransactionContext::ClearTransaction() {
	SetAutoCommit(true);
	current_transaction = nullptr;
}